

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket::test_method(caddrinfo_get_tried_bucket *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  bool bVar9;
  span<const_std::byte,_18446744073709551615UL> source;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  NetGroupManager ngm_asmap;
  vector<bool,_std::allocator<bool>_> asmap;
  int bucket;
  AddrInfo infoj;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CAddress addr2;
  CAddress addr1;
  char *pcVar10;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  int local_5a4;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  vector<bool,_std::allocator<bool>_> local_4f0;
  NetGroupManager local_4c8;
  vector<bool,_std::allocator<bool>_> local_498;
  direct_or_indirect local_470;
  uint local_460;
  char *local_458;
  uint16_t local_450;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  direct_or_indirect local_3e8;
  uint local_3d8;
  undefined1 local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  direct_or_indirect local_368;
  uint local_358;
  char *local_350;
  uint16_t local_348;
  undefined1 local_340 [16];
  shared_count sStack_330;
  char *local_328;
  uint16_t local_320;
  NodeSeconds local_318;
  ServiceFlags local_310;
  undefined **local_308 [2];
  shared_count sStack_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  void *local_2c0;
  uint local_2b0;
  undefined1 local_288 [8];
  element_type *local_280;
  shared_count sStack_278;
  _Base_ptr local_270;
  _Base_ptr local_268;
  ulong local_260;
  undefined1 local_258 [16];
  undefined8 local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_240;
  uchar local_238 [8];
  NodeSeconds NStack_230;
  ServiceFlags local_228;
  NodeSeconds NStack_220;
  NodeSeconds local_218;
  direct_or_indirect dStack_210;
  undefined8 uStack_200;
  uint64_t local_1f8;
  uint256 local_1d8;
  uint256 local_1b8;
  direct_or_indirect local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [3];
  void *local_150;
  uint local_140;
  direct_or_indirect local_118;
  uint local_108;
  direct_or_indirect local_f8;
  uint local_e8;
  undefined8 local_e0;
  undefined2 local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  undefined8 local_b8;
  undefined2 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  source._M_extent._M_extent_value = 0x3b;
  source._M_ptr = test::data::detail_asmap_raw;
  FromBytes(&local_498,source);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_4f0,&local_498);
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset;
  local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ =
       local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._12_4_;
  local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_4f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.1.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&local_198.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = local_80;
  local_50 = local_78;
  local_48 = 100000000;
  local_40 = 0;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.1.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_198.indirect_contents,9999
                );
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_b8 = local_e0;
  local_b0 = local_d8;
  local_a8 = 100000000;
  local_a0 = 0;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.1.1","");
  ResolveIP((CNetAddr *)&local_118.indirect_contents,(string *)&local_198.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  AddrInfo::AddrInfo((AddrInfo *)&local_198.indirect_contents,
                     (CAddress *)&local_70.indirect_contents,
                     (CNetAddr *)&local_118.indirect_contents);
  dStack_210.direct[8] = '\0';
  dStack_210.direct[9] = '\0';
  dStack_210.direct[10] = '\0';
  dStack_210.direct[0xb] = '\0';
  dStack_210.direct[0xc] = '\0';
  dStack_210.direct[0xd] = '\0';
  dStack_210.direct[0xe] = '\0';
  dStack_210.direct[0xf] = '\0';
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218.__d.__r = (duration)0;
  dStack_210.indirect_contents.indirect = (char *)0x0;
  local_228 = NODE_NONE;
  NStack_220.__d.__r = (duration)0;
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  NStack_230.__d.__r = (duration)0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  pbStack_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_258._0_8_ = (_func_int **)0x0;
  local_258._8_8_ = 0;
  local_1f8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_258);
  local_308[0]._0_4_ = 1;
  CSHA256::Write((CSHA256 *)local_258,(uchar *)local_308,4);
  HashWriter::GetHash(&local_1b8,(HashWriter *)local_258);
  dStack_210.direct[8] = '\0';
  dStack_210.direct[9] = '\0';
  dStack_210.direct[10] = '\0';
  dStack_210.direct[0xb] = '\0';
  dStack_210.direct[0xc] = '\0';
  dStack_210.direct[0xd] = '\0';
  dStack_210.direct[0xe] = '\0';
  dStack_210.direct[0xf] = '\0';
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218.__d.__r = (duration)0;
  dStack_210.indirect_contents.indirect = (char *)0x0;
  local_228 = NODE_NONE;
  NStack_220.__d.__r = (duration)0;
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  NStack_230.__d.__r = (duration)0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  pbStack_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_258._0_8_ = (_func_int **)0x0;
  local_258._8_8_ = 0;
  local_1f8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_258);
  local_308[0] = (undefined **)CONCAT44(local_308[0]._4_4_,2);
  CSHA256::Write((CSHA256 *)local_258,(uchar *)local_308,4);
  HashWriter::GetHash(&local_1d8,(HashWriter *)local_258);
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x256;
  file.m_begin = (iterator)&local_500;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_510,msg);
  local_340._8_8_ = local_340._8_8_ & 0xffffffffffffff00;
  local_340._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_3e8._0_4_ =
       AddrInfo::GetTriedBucket((AddrInfo *)&local_198.indirect_contents,&local_1b8,&local_4c8);
  local_3a8._M_dataplus._M_p = (pointer)&local_3e8;
  local_3c8._0_8_ = &local_408;
  local_288[0] = local_3e8._0_4_ == 0xec;
  local_408._M_dataplus._M_p._0_4_ = 0xec;
  local_280 = (element_type *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._M_string_length = 0xe52ae3;
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
  local_308[1] = (undefined **)((ulong)local_308[1] & 0xffffffffffffff00);
  local_308[0] = &PTR__lazy_ostream_013abcf0;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar10 = "info1.GetTriedBucket(nKey1, ngm_asmap)";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  pbStack_240 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_288,(lazy_ostream *)local_340,1,2,REQUIRE,0xe53aad,
             (size_t)&local_388,0x256,(HashWriter *)local_258,"236",local_308);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x25a;
  file_00.m_begin = (iterator)&local_520;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_530,
             msg_00);
  iVar2 = AddrInfo::GetTriedBucket((AddrInfo *)&local_198.indirect_contents,&local_1b8,&local_4c8);
  iVar3 = AddrInfo::GetTriedBucket((AddrInfo *)&local_198.indirect_contents,&local_1d8,&local_4c8);
  local_308[0] = (undefined **)CONCAT71(local_308[0]._1_7_,iVar2 != iVar3);
  local_308[1] = (undefined **)0x0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_340._0_8_ =
       "info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap)";
  local_340._8_8_ =
       (long)"info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap)" +
       0x50;
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013abc70;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_538 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  pbStack_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_308,(lazy_ostream *)local_258,1,0,WARN,(check_type)pcVar10,
             (size_t)&local_540,0x25a);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  AddrInfo::AddrInfo((AddrInfo *)local_258,(CAddress *)&local_d0.indirect_contents,
                     (CNetAddr *)&local_118.indirect_contents);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x260;
  file_01.m_begin = (iterator)&local_550;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_560,
             msg_01);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                   (CService *)&local_198.indirect_contents);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,
                   (CService *)local_258);
  bVar9 = true;
  if ((long)local_280 - (long)local_288 ==
      local_388._M_string_length - (long)local_388._M_dataplus._M_p) {
    if ((undefined1  [8])local_280 == local_288) {
      bVar9 = false;
    }
    else {
      iVar2 = bcmp((void *)local_288,local_388._M_dataplus._M_p,(long)local_280 - (long)local_288);
      bVar9 = iVar2 != 0;
    }
  }
  local_340[0] = bVar9;
  local_340._8_8_ = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_3a8._M_dataplus._M_p = "info1.GetKey() != info2.GetKey()";
  local_3a8._M_string_length = 0xe538e2;
  local_308[1] = (undefined **)((ulong)local_308[1] & 0xffffffffffffff00);
  local_308[0] = &PTR__lazy_ostream_013abc70;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_568 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_2f0 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_340,(lazy_ostream *)local_308,1,0,WARN,(check_type)pcVar10,
             (size_t)&local_570,0x260);
  boost::detail::shared_count::~shared_count(&sStack_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_388._M_dataplus._M_p,
                    local_388.field_2._M_allocated_capacity - (long)local_388._M_dataplus._M_p);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,(long)sStack_278.pi_ - (long)local_288);
  }
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x261;
  file_02.m_begin = (iterator)&local_580;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_590,
             msg_02);
  iVar2 = AddrInfo::GetTriedBucket((AddrInfo *)&local_198.indirect_contents,&local_1b8,&local_4c8);
  iVar3 = AddrInfo::GetTriedBucket((AddrInfo *)local_258,&local_1b8,&local_4c8);
  local_340[0] = iVar2 != iVar3;
  local_340._8_8_ = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_288 = (undefined1  [8])0xe53b29;
  local_280 = (element_type *)0xe53b79;
  local_308[1] = (undefined **)((ulong)local_308[1] & 0xffffffffffffff00);
  local_308[0] = &PTR__lazy_ostream_013abc70;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_598 = "";
  pvVar7 = (iterator)0x0;
  local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_340,(lazy_ostream *)local_308,1,0,WARN,(check_type)pcVar10,
             (size_t)&local_5a0,0x261);
  boost::detail::shared_count::~shared_count(&sStack_330);
  local_270 = (_Base_ptr)&local_280;
  local_280 = (element_type *)((ulong)local_280 & 0xffffffff00000000);
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_260 = 0;
  local_5a4 = 0;
  paVar1 = &local_408.field_2;
  local_268 = local_270;
  do {
    util::ToString<int>((string *)local_3c8,&local_5a4);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_3c8,0,0,"101.",4);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_3a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_3a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_3a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_3a8._M_dataplus._M_p = (pointer)paVar6;
    }
    local_3a8._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_3a8,".1.1");
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_388.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_388.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_388.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_388._M_dataplus._M_p = (pointer)paVar6;
    }
    local_388._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_368.indirect_contents,&local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_340,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368.indirect_contents);
    local_328 = local_350;
    local_320 = local_348;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>(&local_448,&local_5a4);
    pvVar8 = (iterator)0x4;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_448,0,0,"101.",4);
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_428.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_428.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_428.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_428._M_dataplus._M_p = (pointer)paVar6;
    }
    local_428._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_428,".1.1");
    local_408._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p == paVar6) {
      local_408.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_408.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_408._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_408.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_408._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3e8.indirect_contents,&local_408);
    AddrInfo::AddrInfo((AddrInfo *)local_308,(CAddress *)local_340,
                       (CNetAddr *)&local_3e8.indirect_contents);
    if (0x10 < local_3d8) {
      free(local_3e8.indirect_contents.indirect);
      local_3e8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free((void *)local_340._0_8_);
      local_340._0_8_ = (_func_int **)0x0;
    }
    if (0x10 < local_358) {
      free(local_368.indirect_contents.indirect);
      local_368.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_3c8._0_8_ != (string *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
    }
    iVar2 = AddrInfo::GetTriedBucket((AddrInfo *)local_308,&local_1b8,&local_4c8);
    local_340._0_4_ = iVar2;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)local_288
               ,(int *)local_340);
    if (0x10 < local_2b0) {
      free(local_2c0);
      local_2c0 = (char *)0x0;
    }
    if (0x10 < (uint)sStack_2f8.pi_) {
      free(local_308[0]);
      local_308[0] = (_func_int **)0x0;
    }
    iVar2 = local_5a4 + 1;
    bVar9 = local_5a4 < 0xfe;
    local_5a4 = iVar2;
  } while (bVar9);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x26d;
  file_03.m_begin = (iterator)&local_5b8;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5c8,
             msg_03);
  local_340[0] = 8 < local_260;
  local_340._8_8_ = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() > 8";
  local_388._M_string_length = 0xe53b91;
  local_308[1] = (undefined **)((ulong)local_308[1] & 0xffffffffffffff00);
  local_308[0] = &PTR__lazy_ostream_013abc70;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_388;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d0 = "";
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_340,(lazy_ostream *)local_308,1,0,WARN,(check_type)pcVar10,
             (size_t)&local_5d8,0x26d);
  boost::detail::shared_count::~shared_count(&sStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_288);
  local_5a4 = 0;
  do {
    util::ToString<int>((string *)local_3c8,&local_5a4);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_3c8,0,0,"250.",4);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_3a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_3a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_3a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_3a8._M_dataplus._M_p = (pointer)paVar6;
    }
    local_3a8._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_3a8,".1.1");
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_388.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_388.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_388.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_388._M_dataplus._M_p = (pointer)paVar6;
    }
    local_388._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_470.indirect_contents,&local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_340,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_470.indirect_contents);
    local_328 = local_458;
    local_320 = local_450;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>(&local_448,&local_5a4);
    pvVar8 = (iterator)0x4;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_448,0,0,"250.",4);
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar6 == paVar5) {
      local_428.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_428.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_428.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_428._M_dataplus._M_p = (pointer)paVar6;
    }
    local_428._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_428,".1.1");
    local_408._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p == paVar6) {
      local_408.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_408.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_408._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_408.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_408._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3e8.indirect_contents,&local_408);
    AddrInfo::AddrInfo((AddrInfo *)local_308,(CAddress *)local_340,
                       (CNetAddr *)&local_3e8.indirect_contents);
    if (0x10 < local_3d8) {
      free(local_3e8.indirect_contents.indirect);
      local_3e8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free((void *)local_340._0_8_);
      local_340._0_8_ = (_func_int **)0x0;
    }
    if (0x10 < local_460) {
      free(local_470.indirect_contents.indirect);
      local_470.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_3c8._0_8_ != (string *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
    }
    iVar2 = AddrInfo::GetTriedBucket((AddrInfo *)local_308,&local_1b8,&local_4c8);
    local_340._0_4_ = iVar2;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)local_288
               ,(int *)local_340);
    if (0x10 < local_2b0) {
      free(local_2c0);
      local_2c0 = (char *)0x0;
    }
    if (0x10 < (uint)sStack_2f8.pi_) {
      free(local_308[0]);
      local_308[0] = (_func_int **)0x0;
    }
    iVar2 = local_5a4 + 1;
    bVar9 = local_5a4 < 0xfe;
    local_5a4 = iVar2;
  } while (bVar9);
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x279;
  file_04.m_begin = (iterator)&local_5e8;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5f8,
             msg_04);
  local_340[0] = local_260 == 8;
  local_340._8_8_ = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() == 8";
  local_388._M_string_length = 0xe53ba5;
  local_308[1] = (undefined **)((ulong)local_308[1] & 0xffffffffffffff00);
  local_308[0] = &PTR__lazy_ostream_013abc70;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_388;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_600 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_340,(lazy_ostream *)local_308,1,0,WARN,(check_type)pcVar10,
             (size_t)&local_608,0x279);
  boost::detail::shared_count::~shared_count(&sStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_288);
  if (0x10 < (size_type)uStack_200) {
    free(dStack_210.indirect_contents.indirect);
    dStack_210.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (size_type)local_248) {
    free((void *)local_258._0_8_);
    local_258._0_8_ = (_func_int **)0x0;
  }
  if (0x10 < local_140) {
    free(local_150);
    local_150 = (void *)0x0;
  }
  if (0x10 < (uint)local_188[0]._0_4_) {
    free(local_198.indirect_contents.indirect);
    local_198.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_108) {
    free(local_118.indirect_contents.indirect);
    local_118.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_c0) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_60) {
    free(local_70.indirect_contents.indirect);
    local_70.indirect_contents.indirect = (char *)0x0;
  }
  if (local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_4c8.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_498.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, ngm_asmap), 236);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, ngm_asmap) != info2.GetTriedBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("101." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("101." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix MAY map to more than
    // 8 buckets.
    BOOST_CHECK(buckets.size() > 8);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix MAY NOT map to more than
    // 8 buckets.
    BOOST_CHECK(buckets.size() == 8);
}